

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte bVar1;
  char cVar2;
  byte *z;
  int iVar3;
  Unicode61Tokenizer *p;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  u16 *puVar9;
  uint uVar10;
  
  iVar3 = 1;
  if ((nArg & 1U) == 0) {
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      p = (Unicode61Tokenizer *)sqlite3Malloc(0xc0);
    }
    else {
      p = (Unicode61Tokenizer *)0x0;
    }
    if (p == (Unicode61Tokenizer *)0x0) {
      iVar3 = 7;
    }
    else {
      memset(p,0,0xc0);
      p->nFold = 0x40;
      p->eRemoveDiacritic = 1;
      iVar3 = sqlite3_initialize();
      if (iVar3 == 0) {
        pcVar4 = (char *)sqlite3Malloc(0x40);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      p->aFold = pcVar4;
      iVar3 = 7;
      if (pcVar4 != (char *)0x0) {
        iVar3 = 0;
      }
      pcVar5 = "L* N* Co";
      if (0 < nArg && pcVar4 != (char *)0x0) {
        lVar8 = 0;
LAB_001f3ea3:
        if (azArg[lVar8] != (char *)0x0) {
          lVar6 = 0;
          do {
            bVar1 = azArg[lVar8][lVar6];
            if (bVar1 == "categories"[lVar6]) {
              if ((ulong)bVar1 == 0) goto LAB_001f3ed4;
            }
            else if (""[bVar1] != ""[(byte)"categories"[lVar6]]) break;
            lVar6 = lVar6 + 1;
          } while( true );
        }
        goto LAB_001f3ee5;
      }
LAB_001f3ef3:
      if (pcVar4 != (char *)0x0) {
        if (*pcVar5 != '\0') {
          iVar3 = 1;
LAB_001f3f37:
          cVar2 = *pcVar5;
          if (cVar2 != '\0') {
            if ((cVar2 == ' ') || (cVar2 == '\t')) {
              pcVar5 = pcVar5 + 1;
              goto LAB_001f3f37;
            }
            p->aCategory[0] = '\x01';
            switch(*pcVar5) {
            case 'L':
              cVar2 = pcVar5[1];
              switch(cVar2) {
              case 'l':
                p->aCategory[5] = '\x01';
                break;
              case 'm':
                p->aCategory[6] = '\x01';
                break;
              case 'n':
              case 'p':
              case 'q':
              case 'r':
              case 's':
                goto switchD_001f3f71_caseD_4f;
              case 'o':
                p->aCategory[7] = '\x01';
                break;
              case 't':
                p->aCategory[8] = '\x01';
                break;
              case 'u':
                p->aCategory[9] = '\x01';
                break;
              default:
                if (cVar2 == '*') {
                  p->aCategory[0x1e] = '\x01';
                  builtin_memcpy(p->aCategory + 5,"\x01\x01\x01\x01\x01",5);
                }
                else {
                  if (cVar2 != 'C') goto switchD_001f3f71_caseD_4f;
                  p->aCategory[0x1e] = '\x01';
                }
              }
              break;
            case 'M':
              bVar1 = pcVar5[1];
              if (bVar1 < 0x65) {
                if (bVar1 == 0x2a) {
                  p->aCategory[10] = '\x01';
                  p->aCategory[0xb] = '\x01';
LAB_001f4183:
                  p->aCategory[0xc] = '\x01';
                }
                else {
                  if (bVar1 != 99) goto switchD_001f3f71_caseD_4f;
                  p->aCategory[10] = '\x01';
                }
              }
              else {
                if (bVar1 != 0x65) {
                  if (bVar1 == 0x6e) goto LAB_001f4183;
                  goto switchD_001f3f71_caseD_4f;
                }
                p->aCategory[0xb] = '\x01';
              }
              break;
            case 'N':
              bVar1 = pcVar5[1];
              if (bVar1 < 0x6c) {
                if (bVar1 == 0x2a) {
                  p->aCategory[0xd] = '\x01';
                  p->aCategory[0xe] = '\x01';
LAB_001f41a7:
                  p->aCategory[0xf] = '\x01';
                }
                else {
                  if (bVar1 != 100) goto switchD_001f3f71_caseD_4f;
                  p->aCategory[0xd] = '\x01';
                }
              }
              else {
                if (bVar1 != 0x6c) {
                  if (bVar1 == 0x6f) goto LAB_001f41a7;
                  goto switchD_001f3f71_caseD_4f;
                }
                p->aCategory[0xe] = '\x01';
              }
              break;
            case 'O':
            case 'Q':
            case 'R':
            case 'T':
            case 'U':
            case 'V':
            case 'W':
            case 'X':
            case 'Y':
              goto switchD_001f3f71_caseD_4f;
            case 'P':
              switch(pcVar5[1]) {
              case 'c':
                p->aCategory[0x10] = '\x01';
                break;
              case 'd':
                p->aCategory[0x11] = '\x01';
                break;
              case 'e':
                p->aCategory[0x12] = '\x01';
                break;
              case 'f':
                p->aCategory[0x13] = '\x01';
                break;
              case 'g':
              case 'h':
              case 'j':
              case 'k':
              case 'l':
              case 'm':
              case 'n':
              case 'p':
              case 'q':
              case 'r':
                goto switchD_001f3f71_caseD_4f;
              case 'i':
                p->aCategory[0x14] = '\x01';
                break;
              case 'o':
                p->aCategory[0x15] = '\x01';
                break;
              case 's':
                p->aCategory[0x16] = '\x01';
                break;
              default:
                if (pcVar5[1] != '*') goto switchD_001f3f71_caseD_4f;
                builtin_memcpy(p->aCategory + 0x10,"\x01\x01\x01\x01\x01\x01\x01",7);
              }
              break;
            case 'S':
              bVar1 = pcVar5[1];
              if (bVar1 < 0x6b) {
                if (bVar1 == 0x2a) {
                  builtin_memcpy(p->aCategory + 0x17,"\x01\x01\x01\x01",4);
                }
                else {
                  if (bVar1 != 99) goto switchD_001f3f71_caseD_4f;
                  p->aCategory[0x17] = '\x01';
                }
              }
              else if (bVar1 == 0x6b) {
                p->aCategory[0x18] = '\x01';
              }
              else if (bVar1 == 0x6d) {
                p->aCategory[0x19] = '\x01';
              }
              else {
                if (bVar1 != 0x6f) goto switchD_001f3f71_caseD_4f;
                p->aCategory[0x1a] = '\x01';
              }
              break;
            case 'Z':
              bVar1 = pcVar5[1];
              if (bVar1 < 0x70) {
                if (bVar1 == 0x2a) {
                  p->aCategory[0x1b] = '\x01';
                  p->aCategory[0x1c] = '\x01';
LAB_001f41cb:
                  p->aCategory[0x1d] = '\x01';
                }
                else {
                  if (bVar1 != 0x6c) goto switchD_001f3f71_caseD_4f;
                  p->aCategory[0x1b] = '\x01';
                }
              }
              else {
                if (bVar1 != 0x70) {
                  if (bVar1 == 0x73) goto LAB_001f41cb;
                  goto switchD_001f3f71_caseD_4f;
                }
                p->aCategory[0x1c] = '\x01';
              }
              break;
            default:
              if (*pcVar5 != 'C') goto switchD_001f3f71_caseD_4f;
              bVar1 = pcVar5[1];
              if (bVar1 < 0x6e) {
                if (bVar1 == 0x2a) {
                  p->aCategory[0x1f] = '\x01';
                  builtin_memcpy(p->aCategory + 1,"\x01\x01\x01\x01",4);
                }
                else if (bVar1 == 99) {
                  p->aCategory[1] = '\x01';
                }
                else {
                  if (bVar1 != 0x66) goto switchD_001f3f71_caseD_4f;
                  p->aCategory[2] = '\x01';
                }
              }
              else if (bVar1 == 0x6e) {
                p->aCategory[3] = '\x01';
              }
              else if (bVar1 == 0x6f) {
                p->aCategory[0x1f] = '\x01';
              }
              else {
                if (bVar1 != 0x73) goto switchD_001f3f71_caseD_4f;
                p->aCategory[4] = '\x01';
              }
            }
          }
          while( true ) {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_001f42fc;
            if ((cVar2 == '\t') || (cVar2 == ' ')) break;
            pcVar5 = pcVar5 + 1;
          }
          goto LAB_001f3f37;
        }
LAB_001f42fc:
        uVar7 = 0;
        puVar9 = aFts5UnicodeData;
        do {
          uVar10 = (*puVar9 >> 5) + uVar7;
          if (0x7f < (int)uVar10) {
            uVar10 = 0x80;
          }
          if ((int)uVar7 < (int)uVar10) {
            memset(p->aTokenChar + (int)uVar7,(uint)p->aCategory[*puVar9 & 0x1f],
                   (ulong)(~uVar7 + uVar10) + 1);
            uVar7 = uVar10;
          }
          puVar9 = puVar9 + 1;
        } while ((int)uVar7 < 0x80);
        p->aTokenChar[0] = '\0';
        iVar3 = 0;
      }
switchD_001f3f71_caseD_4f:
      if (0 < nArg && iVar3 == 0) {
        lVar8 = 0;
LAB_001f4393:
        pcVar4 = azArg[lVar8];
        iVar3 = 1;
        if (pcVar4 != (char *)0x0) {
          z = (byte *)azArg[lVar8 + 1];
          lVar6 = 0;
          do {
            bVar1 = pcVar4[lVar6];
            if (bVar1 == "remove_diacritics"[lVar6]) {
              if ((ulong)bVar1 == 0) goto LAB_001f43cf;
            }
            else if (""[bVar1] != ""[(byte)"remove_diacritics"[lVar6]]) {
              iVar3 = 1;
              if (pcVar4 == (char *)0x0) break;
              lVar6 = 0;
              goto LAB_001f4411;
            }
            lVar6 = lVar6 + 1;
          } while( true );
        }
        goto LAB_001f448e;
      }
    }
LAB_001f44dc:
    if (iVar3 != 0) {
      fts5UnicodeDelete((Fts5Tokenizer *)p);
      p = (Unicode61Tokenizer *)0x0;
    }
    *ppOut = (Fts5Tokenizer *)p;
  }
  return iVar3;
LAB_001f3ed4:
  pcVar5 = azArg[lVar8 + 1];
LAB_001f3ee5:
  if ((pcVar4 == (char *)0x0) || (lVar8 = lVar8 + 2, nArg <= (int)lVar8)) goto LAB_001f3ef3;
  goto LAB_001f3ea3;
LAB_001f4411:
  bVar1 = pcVar4[lVar6];
  if (bVar1 == "tokenchars"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001f4433;
  }
  else if (""[bVar1] != ""[(byte)"tokenchars"[lVar6]]) {
    iVar3 = 1;
    if (pcVar4 == (char *)0x0) goto LAB_001f448e;
    lVar6 = 0;
    goto LAB_001f4453;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001f4411;
LAB_001f4453:
  bVar1 = pcVar4[lVar6];
  if (bVar1 == "separators"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001f4475;
  }
  else if (""[bVar1] != ""[(byte)"separators"[lVar6]]) {
    iVar3 = 1;
    if (pcVar4 == (char *)0x0) goto LAB_001f448e;
    lVar6 = 0;
    goto LAB_001f44af;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001f4453;
LAB_001f44af:
  bVar1 = pcVar4[lVar6];
  if (bVar1 == "categories"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001f43fc;
  }
  else if (""[bVar1] != ""[(byte)"categories"[lVar6]]) {
    iVar3 = 1;
    goto LAB_001f448e;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001f44af;
LAB_001f4475:
  iVar3 = 0;
  goto LAB_001f447c;
LAB_001f4433:
  iVar3 = 1;
LAB_001f447c:
  iVar3 = fts5UnicodeAddExceptions(p,(char *)z,iVar3);
LAB_001f448e:
  if ((iVar3 != 0) || (lVar8 = lVar8 + 2, nArg <= (int)lVar8)) goto LAB_001f44dc;
  goto LAB_001f4393;
LAB_001f43cf:
  iVar3 = 1;
  if (((byte)(*z - 0x30) < 3) && (z[1] == 0)) {
    p->eRemoveDiacritic = *z - 0x30;
LAB_001f43fc:
    iVar3 = 0;
  }
  goto LAB_001f448e;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }
      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }
    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}